

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::IndirectDispatchBufferStorageTestCase::execute
          (IndirectDispatchBufferStorageTestCase *this,GLuint sparse_bo_storage_flags)

{
  ostringstream *this_00;
  GLenum GVar1;
  uint uVar2;
  Functions *pFVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  long lVar9;
  uint zero_ac_value;
  undefined4 local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  (*this->m_gl->bindBuffer)(0x92c0,this->m_helper_bo);
  (*this->m_gl->bindBuffer)(0x90ee,this->m_sparse_bo);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBuffer() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xa45);
  lVar9 = 0;
  (*this->m_gl->bindBufferRange)(0x92c0,0,this->m_helper_bo,0xc,4);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBindBufferRange() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xa4a);
  (*this->m_gl->useProgram)(this->m_po);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xa4e);
  local_1b4 = 0;
  (*this->m_gl->bufferSubData)(0x92c0,0xc,4,&local_1b4);
  GVar1 = (*this->m_gl->getError)();
  glu::checkError(GVar1,"glBufferSubData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0xa56);
  this->m_expected_ac_value = 0;
  bVar8 = true;
  do {
    if ((int)lVar9 == 2) {
      uVar2 = this->m_page_size;
      uVar6 = (this->m_dispatch_draw_call_args_start_offset + 6) / uVar2;
      uVar5 = uVar6 * uVar2;
      uVar2 = (this->m_sparse_bo_size_rounded - uVar5) / uVar2;
      if (0 < (int)uVar2) {
        uVar2 = 1;
      }
      (*this->m_gl->bufferPageCommitmentARB)(0x90ee,0,(ulong)uVar5,'\x01');
      pFVar3 = this->m_gl;
      uVar7 = (ulong)(uVar6 * this->m_page_size);
      uVar2 = uVar2 * this->m_page_size;
LAB_00a512e6:
      (*pFVar3->bufferPageCommitmentARB)(0x90ee,uVar7,(ulong)uVar2,'\0');
    }
    else {
      if ((int)lVar9 == 1) {
        pFVar3 = this->m_gl;
        uVar2 = this->m_sparse_bo_size_rounded;
        uVar7 = 0;
        goto LAB_00a512e6;
      }
      (*this->m_gl->bufferPageCommitmentARB)(0x90ee,0,(ulong)this->m_sparse_bo_size_rounded,'\x01');
      this->m_expected_ac_value =
           this->m_expected_ac_value + this->m_local_wg_size_x * this->m_global_wg_size_x;
    }
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBufferPageCommitmentARB() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xa90);
    (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
    (*this->m_gl->bindBuffer)(0x8f37,this->m_sparse_bo);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glBindBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xa95);
    (*this->m_gl->copyBufferSubData)
              (0x8f36,0x8f37,0,(ulong)this->m_dispatch_draw_call_args_start_offset,0xc);
    (*this->m_gl->dispatchComputeIndirect)((ulong)this->m_dispatch_draw_call_args_start_offset);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glDispatchComputeIndirect() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xa9c);
    puVar4 = (uint *)(*this->m_gl->mapBufferRange)(0x92c0,0xc,4,1);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glMapBufferRange() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xaa4);
    if ((*puVar4 != this->m_expected_ac_value) && (bVar8)) {
      local_1b0._0_8_ = this->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Invalid atomic counter value encountered at iteration [",0x37);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"]. Expected value:[",0x13);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], found:[",10);
      std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"].",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      bVar8 = false;
    }
    (*this->m_gl->unmapBuffer)(0x92c0);
    GVar1 = (*this->m_gl->getError)();
    glu::checkError(GVar1,"glUnmapBuffer() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                    ,0xab7);
    lVar9 = lVar9 + 1;
    if (lVar9 == 3) {
      return bVar8;
    }
  } while( true );
}

Assistant:

bool IndirectDispatchBufferStorageTestCase::execute(glw::GLuint sparse_bo_storage_flags)
{
	(void)sparse_bo_storage_flags;
	bool result = true;

	/* Set up the buffer bindings */
	m_gl.bindBuffer(GL_ATOMIC_COUNTER_BUFFER, m_helper_bo);
	m_gl.bindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_sparse_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call(s) failed");

	m_gl.bindBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, /* index */
						 m_helper_bo, 12,			  /* offset */
						 4);						  /* size */
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferRange() call failed.");

	/* Bind the compute program */
	m_gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUseProgram() call failed.");

	/* Zero out atomic counter value. */
	const unsigned int zero_ac_value = 0;

	m_gl.bufferSubData(GL_ATOMIC_COUNTER_BUFFER, 12, /* offset */
					   4,							 /* size */
					   &zero_ac_value);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferSubData() call failed.");

	m_expected_ac_value = zero_ac_value;

	/* Run the test in three iterations:
	 *
	 * 1) All arguments are located in committed memory page(s).
	 * 2) None of the arguments are located in committed memory page(s).
	 * 3) Some of the arguments are located in committed memory page(s),
	 *    and some aren't.
	 */
	for (unsigned int n_iteration = 0; n_iteration < 3; ++n_iteration)
	{
		/* Commit the pages in the iteration-specific manner */
		switch (n_iteration)
		{
		case 0:
		{
			m_gl.bufferPageCommitmentARB(GL_DISPATCH_INDIRECT_BUFFER, 0,	 /* offset */
										 m_sparse_bo_size_rounded, GL_TRUE); /* commit */

			m_expected_ac_value += m_global_wg_size_x * m_local_wg_size_x;

			break;
		}

		case 1:
		{
			m_gl.bufferPageCommitmentARB(GL_DISPATCH_INDIRECT_BUFFER, 0,	  /* offset */
										 m_sparse_bo_size_rounded, GL_FALSE); /* commit */

			break;
		}

		case 2:
		{
			const unsigned int n_args_size = sizeof(unsigned int) * 3;
			const unsigned int decommit_page_start_index =
				(m_dispatch_draw_call_args_start_offset + (n_args_size / 2)) / m_page_size;
			const unsigned int n_pages_to_decommit = (unsigned int)de::min(
				(int)((m_sparse_bo_size_rounded - decommit_page_start_index * m_page_size) / m_page_size), (int)1);

			DE_ASSERT(decommit_page_start_index != 0);

			m_gl.bufferPageCommitmentARB(GL_DISPATCH_INDIRECT_BUFFER, 0, /* offset */
										 decommit_page_start_index * m_page_size, GL_TRUE);
			m_gl.bufferPageCommitmentARB(GL_DISPATCH_INDIRECT_BUFFER, decommit_page_start_index * m_page_size,
										 n_pages_to_decommit * m_page_size, GL_FALSE);

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized iteratino index");
		}
		} /* switch (n_iteration) */

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferPageCommitmentARB() call(s) failed.");

		/* Copy the indirect dispatch call args data from the helper BO to the sparse BO */
		m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
		m_gl.bindBuffer(GL_COPY_WRITE_BUFFER, m_sparse_bo);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

		m_gl.copyBufferSubData(GL_COPY_READ_BUFFER, GL_COPY_WRITE_BUFFER, 0, /* readOffset */
							   m_dispatch_draw_call_args_start_offset, sizeof(unsigned int) * 3);

		/* Run the program */
		m_gl.dispatchComputeIndirect(m_dispatch_draw_call_args_start_offset);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glDispatchComputeIndirect() call failed.");

		/* Extract the AC value and verify it */
		const unsigned int* ac_data_ptr =
			(const unsigned int*)m_gl.mapBufferRange(GL_ATOMIC_COUNTER_BUFFER, 12, /* offset */
													 4,							   /* length */
													 GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glMapBufferRange() call failed.");

		if (*ac_data_ptr != m_expected_ac_value && result)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Invalid atomic counter value encountered at iteration "
														   "["
							   << n_iteration << "]"
												 ". Expected value:"
												 "["
							   << m_expected_ac_value << "]"
														 ", found:"
														 "["
							   << *ac_data_ptr << "]." << tcu::TestLog::EndMessage;

			result = false;
		}

		/* Unmap the buffer before we move on with the next iteration */
		m_gl.unmapBuffer(GL_ATOMIC_COUNTER_BUFFER);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glUnmapBuffer() call failed.");
	} /* for (all three iterations) */

	return result;
}